

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void DoAccept<true>::Do(ResxData *data,cmSourceFile *f)

{
  pointer *pppcVar1;
  pointer pcVar2;
  iterator __position;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  string hFileName;
  string resx;
  cmSourceFile *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  local_80 = f;
  psVar3 = cmSourceFile::GetFullPath(f,(string *)0x0);
  pcVar2 = (psVar3->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar2,pcVar2 + psVar3->_M_string_length);
  std::__cxx11::string::find_last_of((char *)local_38,0x503179,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)local_58,(ulong)local_38);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_58);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_78.field_2._M_allocated_capacity = *psVar5;
    local_78.field_2._8_8_ = plVar4[3];
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar5;
    local_78._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_78._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)data,&local_78);
  __position._M_current =
       (data->ResxSources).
       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (data->ResxSources).
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>::
    _M_realloc_insert<cmSourceFile_const*const&>
              ((vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>> *)&data->ResxSources
               ,__position,&local_80);
  }
  else {
    *__position._M_current = local_80;
    pppcVar1 = &(data->ResxSources).
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

static void Do(cmGeneratorTarget::ResxData& data, cmSourceFile* f)
    {
    // Build and save the name of the corresponding .h file
    // This relationship will be used later when building the project files.
    // Both names would have been auto generated from Visual Studio
    // where the user supplied the file name and Visual Studio
    // appended the suffix.
    std::string resx = f->GetFullPath();
    std::string hFileName = resx.substr(0, resx.find_last_of(".")) + ".h";
    data.ExpectedResxHeaders.insert(hFileName);
    data.ResxSources.push_back(f);
    }